

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<int,QByteArray>::emplaceValue<QByteArray_const&>
          (Node<int,_QByteArray> *this,QByteArray *args)

{
  long lVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffffb8);
  QByteArray::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QByteArray::~QByteArray((QByteArray *)0xab1ecb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }